

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout.cpp
# Opt level: O0

int __thiscall ncnn::Dropout::forward_inplace(Dropout *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  long in_RSI;
  long in_RDI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  int local_98;
  int in_stack_ffffffffffffff74;
  Mat *in_stack_ffffffffffffff78;
  int local_34;
  
  if ((*(float *)(in_RDI + 0xd0) != 1.0) || (NAN(*(float *)(in_RDI + 0xd0)))) {
    iVar1 = *(int *)(in_RSI + 0x2c);
    iVar2 = *(int *)(in_RSI + 0x30);
    iVar3 = *(int *)(in_RSI + 0x38);
    for (local_34 = 0; local_34 < iVar3; local_34 = local_34 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      pfVar4 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff78);
      ncnn::Mat::~Mat((Mat *)0x3802f7);
      for (local_98 = 0; local_98 < iVar1 * iVar2; local_98 = local_98 + 1) {
        pfVar4[local_98] = pfVar4[local_98] * *(float *)(in_RDI + 0xd0);
      }
    }
  }
  return 0;
}

Assistant:

int Dropout::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] * scale;
        }
    }

    return 0;
}